

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O3

void testAttrFloatVectors(string *tempdir)

{
  int iVar1;
  exr_context_t p_Var2;
  long lVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  char *in_RCX;
  char *pcVar9;
  _internal_exr_context *pctxt;
  exr_context_t __dest;
  exr_context_t f;
  exr_context_t local_20;
  
  p_Var2 = createDummyFile("<floatvector>");
  local_20 = p_Var2;
  if (p_Var2 == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(p_Var2 + 0x40))
                      (p_Var2,3,"Invalid reference to float vector object to initialize");
    if (iVar1 == 3) {
      pcVar9 = (char *)0xfffffffc;
      iVar1 = (**(code **)(p_Var2 + 0x48))
                        (p_Var2,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (iVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(iVar1);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(3);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_init (f, &fv, -4)",(char *)0x1cf,0x17d415,pcVar9);
      }
      iVar1 = (**(code **)(p_Var2 + 0x40))
                        (p_Var2,3,"Invalid (NULL) arguments to float vector create");
      if (iVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(iVar1);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(3);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_create (f, __null, fdata, 4)",(char *)0x1d2,0x17d415,
                       pcVar9);
      }
      iVar1 = (**(code **)(p_Var2 + 0x40))
                        (p_Var2,3,"Invalid (NULL) arguments to float vector create");
      if (iVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(iVar1);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(3);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_create (f, &fv, __null, 4)",(char *)0x1d5,0x17d415,
                       pcVar9);
      }
      pcVar9 = (char *)0xfffffffc;
      iVar1 = (**(code **)(p_Var2 + 0x48))
                        (p_Var2,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (iVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(iVar1);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(3);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, -4)",(char *)0x1d8,0x17d415,
                       pcVar9);
      }
      pcVar9 = (char *)0x3fffffff;
      __dest = p_Var2;
      iVar1 = (**(code **)(p_Var2 + 0x48))
                        (p_Var2,3,"Invalid too large size for float vector (%d entries)");
      if (iVar1 != 3) {
        if (iVar1 == 0) {
          memcpy(__dest,&DAT_0017aea0,0xfffffffc);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(iVar1);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(3);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, (2147483647) / 2)",
                       (char *)0x1de,0x17d415,pcVar9);
      }
      iVar1 = (**(code **)(p_Var2 + 0x40))
                        (p_Var2,3,"Invalid reference to float vector object to initialize");
      if (iVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(iVar1);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(3);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_init_static (f, __null, fdata, 4)",(char *)0x1e1,
                       0x17d415,pcVar9);
      }
      iVar1 = (**(code **)(p_Var2 + 0x40))
                        (p_Var2,3,"Invalid reference to float array object to initialize");
      if (iVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(iVar1);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar7 = (char *)exr_get_default_error_message(3);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_init_static (f, &fv, __null, 4)",(char *)0x1e4,
                       0x17d415,pcVar9);
      }
      pcVar9 = (char *)0xfffffffc;
      iVar1 = (**(code **)(p_Var2 + 0x48))
                        (p_Var2,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (iVar1 == 3) {
        lVar3 = (**(code **)(p_Var2 + 0x58))(0x10);
        if (lVar3 == 0) {
          iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
          if (iVar1 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
            pcVar7 = (char *)exr_get_default_error_message(iVar1);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            core_test_fail("exr_attr_float_vector_init (f, &fv, 4)",(char *)0x1ee,0x17d415,pcVar9);
          }
          core_test_fail("fv.length == 4",(char *)0x1ef,0x17d415,pcVar9);
        }
        (**(code **)(p_Var2 + 0x60))(lVar3);
        puVar4 = (undefined4 *)(**(code **)(p_Var2 + 0x58))(0x10);
        if (puVar4 != (undefined4 *)0x0) {
          *puVar4 = 0x3f800000;
          puVar4[1] = 0x40000000;
          puVar4[2] = 0x40400000;
          puVar4[3] = 0x40800000;
          (**(code **)(p_Var2 + 0x60))(puVar4);
          s_malloc_fail_on = 1;
          puVar5 = (undefined8 *)(**(code **)(p_Var2 + 0x58))(0x10);
          if ((puVar5 == (undefined8 *)0x0) &&
             (iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1), iVar1 != 0)) {
            s_malloc_fail_on = 0;
            if (iVar1 == 1) {
              exr_finish(&local_20);
              return;
            }
          }
          else {
            *puVar5 = 0x400000003f800000;
            puVar5[1] = 0x4080000040400000;
            iVar1 = 0;
          }
          s_malloc_fail_on = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
          pcVar7 = (char *)exr_get_default_error_message(iVar1);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
          pcVar7 = (char *)exr_get_default_error_message(1);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x201,0x17d415,
                         pcVar9);
        }
        iVar1 = (**(code **)(p_Var2 + 0x38))(p_Var2,1);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
          pcVar7 = (char *)exr_get_default_error_message(iVar1);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x1f7,0x17d415,
                         pcVar9);
        }
        _DAT_00000000 = 0x400000003f800000;
        uRam0000000000000008 = 0x4080000040400000;
        core_test_fail("fv.length == 4",(char *)0x1f8,0x17d415,pcVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
      pcVar7 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar8 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
      pcVar7 = (char *)exr_get_default_error_message(3);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar8 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      core_test_fail("exr_attr_float_vector_init_static (f, &fv, fdata, -4)",(char *)0x1e7,0x17d415,
                     pcVar9);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
  pcVar9 = (char *)exr_get_default_error_message(iVar1);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar8 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
  pcVar9 = (char *)exr_get_default_error_message(3);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar8 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar8);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  core_test_fail("exr_attr_float_vector_init (f, __null, 4)",(char *)0x1cb,0x17d415,in_RCX);
}

Assistant:

void
testAttrFloatVectors (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testFloatVectorHelper (NULL);
    exr_context_t f = createDummyFile ("<floatvector>");
    testFloatVectorHelper (f);
    exr_finish (&f);
}